

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void LenEnc_Encode2(CLenPriceEnc *p,CRangeEnc *rc,UInt32 symbol,UInt32 posState,
                   Bool_conflict updatePrice,UInt32 *ProbPrices)

{
  UInt32 *pUVar1;
  int numBitLevels;
  UInt16 *pUVar2;
  
  if (symbol < 8) {
    RangeEnc_EncodeBit(rc,(UInt16 *)p,0);
    pUVar2 = (p->p).low + posState * 8;
  }
  else {
    RangeEnc_EncodeBit(rc,(UInt16 *)p,1);
    pUVar2 = &(p->p).choice2;
    if (0xf < symbol) {
      RangeEnc_EncodeBit(rc,pUVar2,1);
      pUVar2 = (p->p).high;
      symbol = symbol - 0x10;
      numBitLevels = 8;
      goto LAB_0010fd2c;
    }
    RangeEnc_EncodeBit(rc,pUVar2,0);
    pUVar2 = (p->p).mid + posState * 8;
    symbol = symbol - 8;
  }
  numBitLevels = 3;
LAB_0010fd2c:
  RcTree_Encode(rc,pUVar2,numBitLevels,symbol);
  if (updatePrice != 0) {
    pUVar1 = p->counters + posState;
    *pUVar1 = *pUVar1 - 1;
    if (*pUVar1 == 0) {
      LenPriceEnc_UpdateTable(p,posState,ProbPrices);
      return;
    }
  }
  return;
}

Assistant:

static void LenEnc_Encode2(CLenPriceEnc *p, CRangeEnc *rc, UInt32 symbol, UInt32 posState, Bool updatePrice, const UInt32 *ProbPrices)
{
  LenEnc_Encode(&p->p, rc, symbol, posState);
  if (updatePrice)
    if (--p->counters[posState] == 0)
      LenPriceEnc_UpdateTable(p, posState, ProbPrices);
}